

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O3

void google::protobuf::internal::WireFormatLite::WriteGroupMaybeToArray
               (int field_number,MessageLite *value,CodedOutputStream *output)

{
  byte *pbVar1;
  uint8 *puVar2;
  bool bVar3;
  int iVar4;
  ulong uVar5;
  undefined4 extraout_var;
  LogMessage *other;
  int iVar6;
  byte *pbVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  LogFinisher local_61;
  LogMessage local_60;
  
  uVar10 = field_number * 8 + 3;
  uVar5 = (ulong)uVar10;
  uVar9 = field_number << 3;
  if (output->buffer_size_ < 5) {
    io::CodedOutputStream::WriteVarint32SlowPath(output,uVar10);
  }
  else {
    pbVar1 = output->buffer_;
    pbVar7 = pbVar1;
    if (0x7f < uVar9) {
      do {
        uVar10 = (uint)uVar5;
        *pbVar7 = (byte)uVar5 | 0x80;
        uVar5 = uVar5 >> 7;
        pbVar7 = pbVar7 + 1;
      } while (0x3fff < uVar10);
    }
    *pbVar7 = (byte)uVar5;
    iVar6 = ((int)pbVar7 - (int)pbVar1) + 1;
    output->buffer_ = output->buffer_ + iVar6;
    output->buffer_size_ = output->buffer_size_ - iVar6;
  }
  iVar6 = (*value->_vptr_MessageLite[0xf])(value);
  if (iVar6 <= output->buffer_size_) {
    puVar2 = output->buffer_;
    output->buffer_ = puVar2 + iVar6;
    output->buffer_size_ = output->buffer_size_ - iVar6;
    if (puVar2 != (uint8 *)0x0) {
      uVar5 = io::CodedOutputStream::default_serialization_deterministic_;
      if (output->serialization_deterministic_is_overridden_ != false) {
        uVar5 = (ulong)output->serialization_deterministic_override_;
      }
      iVar4 = (*value->_vptr_MessageLite[0x10])(value,(ulong)(uVar5 != 0),puVar2);
      if (CONCAT44(extraout_var,iVar4) - (long)puVar2 != (long)iVar6) {
        LogMessage::LogMessage
                  (&local_60,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/wire_format_lite.cc"
                   ,0x236);
        other = LogMessage::operator<<(&local_60,"CHECK failed: (end - target) == (size): ");
        LogFinisher::operator=(&local_61,other);
        LogMessage::~LogMessage(&local_60);
      }
      goto LAB_00322a46;
    }
  }
  (*value->_vptr_MessageLite[0xd])(value,output);
LAB_00322a46:
  uVar10 = uVar9 | 4;
  if (output->buffer_size_ < 5) {
    io::CodedOutputStream::WriteVarint32SlowPath(output,uVar10);
  }
  else {
    pbVar1 = output->buffer_;
    pbVar7 = pbVar1;
    uVar8 = uVar10;
    if (0x7f < uVar9) {
      do {
        *pbVar7 = (byte)uVar10 | 0x80;
        uVar8 = uVar10 >> 7;
        pbVar7 = pbVar7 + 1;
        bVar3 = 0x3fff < uVar10;
        uVar10 = uVar8;
      } while (bVar3);
    }
    *pbVar7 = (byte)uVar8;
    iVar6 = ((int)pbVar7 - (int)pbVar1) + 1;
    output->buffer_ = output->buffer_ + iVar6;
    output->buffer_size_ = output->buffer_size_ - iVar6;
  }
  return;
}

Assistant:

void WireFormatLite::WriteGroupMaybeToArray(int field_number,
                                            const MessageLite& value,
                                            io::CodedOutputStream* output) {
  WriteTag(field_number, WIRETYPE_START_GROUP, output);
  const int size = value.GetCachedSize();
  uint8* target = output->GetDirectBufferForNBytesAndAdvance(size);
  if (target != NULL) {
    uint8* end = value.InternalSerializeWithCachedSizesToArray(
        output->IsSerializationDeterministic(), target);
    GOOGLE_DCHECK_EQ(end - target, size);
  } else {
    value.SerializeWithCachedSizes(output);
  }
  WriteTag(field_number, WIRETYPE_END_GROUP, output);
}